

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O3

void __thiscall QScrollBar::mouseMoveEvent(QScrollBar *this,QMouseEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  QScrollBarPrivate *this_00;
  QWidgetData *pQVar6;
  bool bVar7;
  QRect QVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  SubControl control;
  int iVar12;
  QStyle *pQVar13;
  long lVar14;
  undefined8 *puVar15;
  QStyleOptionSlider *pQVar16;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  QRect QVar19;
  undefined1 auVar20 [16];
  QStyleOptionSlider opt;
  QRect local_d0;
  QRect local_c0;
  QStyleOptionSlider local_b0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if (this_00->pressedControl == SC_None) goto LAB_004749d0;
  puVar15 = &DAT_006dcab0;
  pQVar16 = &local_b0;
  for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar5 = *puVar15;
    (pQVar16->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar5;
    (pQVar16->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar5 >> 0x20);
    puVar15 = puVar15 + 1;
    pQVar16 = (QStyleOptionSlider *)&(pQVar16->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b0);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_b0);
  QVar8.x2.m_i = local_c0.x2.m_i;
  QVar8.y2.m_i = local_c0.y2.m_i;
  QVar8.x1.m_i = local_c0.x1.m_i;
  QVar8.y1.m_i = local_c0.y1.m_i;
  QVar19.x2.m_i = local_d0.x2.m_i;
  QVar19.y2.m_i = local_d0.y2.m_i;
  QVar19.x1.m_i = local_d0.x1.m_i;
  QVar19.y1.m_i = local_d0.y1.m_i;
  if ((*(uint *)(e + 0x44) & 1) == 0) {
    if ((*(uint *)(e + 0x44) & 4) != 0) {
      pQVar13 = QWidget::style((QWidget *)this);
      iVar11 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,2,&local_b0,this,0);
      QVar8.x2.m_i = local_c0.x2.m_i;
      QVar8.y2.m_i = local_c0.y2.m_i;
      QVar8.x1.m_i = local_c0.x1.m_i;
      QVar8.y1.m_i = local_c0.y1.m_i;
      QVar19.x2.m_i = local_d0.x2.m_i;
      QVar19.y2.m_i = local_d0.y2.m_i;
      QVar19.x1.m_i = local_d0.x1.m_i;
      QVar19.y1.m_i = local_d0.y1.m_i;
      if (iVar11 != 0) goto LAB_00474613;
    }
  }
  else {
LAB_00474613:
    if (this_00->pressedControl == SC_ScrollBarSlider) {
      auVar20 = QEventPoint::position();
      if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) == 1) {
        dVar17 = (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar20._0_8_;
        bVar7 = 2147483647.0 < dVar17;
        if (dVar17 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        dVar17 = (double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      }
      else {
        dVar17 = (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar20._8_8_;
        bVar7 = 2147483647.0 < dVar17;
        if (dVar17 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        dVar17 = (double)(-(ulong)bVar7 & 0x41dfffffffc00000 | ~-(ulong)bVar7 & (ulong)dVar17);
      }
      iVar11 = QScrollBarPrivate::pixelPosToRangeValue(this_00,(int)dVar17 - this_00->clickOffset);
      pQVar13 = QWidget::style((QWidget *)this);
      iVar12 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,8,&local_b0,this);
      if (-1 < iVar12) {
        pQVar6 = (this->super_QAbstractSlider).super_QWidget.data;
        local_c0.y1.m_i = -iVar12;
        local_c0.x1.m_i = -iVar12;
        uVar1 = (pQVar6->crect).x2;
        uVar3 = (pQVar6->crect).y2;
        uVar2 = (pQVar6->crect).x1;
        uVar4 = (pQVar6->crect).y1;
        local_c0.x2.m_i = iVar12 + (uVar1 - uVar2);
        local_c0.y2.m_i = iVar12 + (uVar3 - uVar4);
        auVar20 = QEventPoint::position();
        dVar18 = (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar20._0_8_;
        dVar17 = dVar18;
        if (dVar18 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        local_d0.x1.m_i =
             (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
        dVar18 = (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar20._8_8_;
        dVar17 = dVar18;
        if (dVar18 <= -2147483648.0) {
          dVar17 = -2147483648.0;
        }
        local_d0.y1.m_i =
             (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                          ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
        cVar9 = QRect::contains((QPoint *)&local_c0,SUB81(&local_d0,0));
        if (cVar9 == '\0') {
          iVar11 = this_00->snapBackPosition;
        }
      }
      QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar11);
      QVar8.x2.m_i = local_c0.x2.m_i;
      QVar8.y2.m_i = local_c0.y2.m_i;
      QVar8.x1.m_i = local_c0.x1.m_i;
      QVar8.y1.m_i = local_c0.y1.m_i;
      QVar19.x2.m_i = local_d0.x2.m_i;
      QVar19.y2.m_i = local_d0.y2.m_i;
      QVar19.x1.m_i = local_d0.x1.m_i;
      QVar19.y1.m_i = local_d0.y1.m_i;
    }
    else {
      pQVar13 = QWidget::style((QWidget *)this);
      iVar11 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,3,&local_b0,this,0);
      QVar8.x2.m_i = local_c0.x2.m_i;
      QVar8.y2.m_i = local_c0.y2.m_i;
      QVar8.x1.m_i = local_c0.x1.m_i;
      QVar8.y1.m_i = local_c0.y1.m_i;
      QVar19.x2.m_i = local_d0.x2.m_i;
      QVar19.y2.m_i = local_d0.y2.m_i;
      QVar19.x1.m_i = local_d0.x1.m_i;
      QVar19.y1.m_i = local_d0.y1.m_i;
      if (iVar11 == 0) {
        pQVar13 = QWidget::style((QWidget *)this);
        iVar11 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x3f,&local_b0,this,0);
        if ((iVar11 == 0) ||
           ((this_00->pressedControl & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None)) {
LAB_004749f7:
          pQVar13 = QWidget::style((QWidget *)this);
          local_c0 = (QRect)(**(code **)(*(long *)pQVar13 + 0xd8))
                                      (pQVar13,2,&local_b0,this_00->pressedControl,this);
          auVar20 = QEventPoint::position();
          dVar18 = (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar20._0_8_;
          dVar17 = dVar18;
          if (dVar18 <= -2147483648.0) {
            dVar17 = -2147483648.0;
          }
          local_d0.x1.m_i =
               (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
          dVar18 = (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar20._8_8_;
          dVar17 = dVar18;
          if (dVar18 <= -2147483648.0) {
            dVar17 = -2147483648.0;
          }
          local_d0.y1.m_i =
               (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
          bVar10 = QRect::contains((QPoint *)&local_c0,SUB81(&local_d0,0));
          QVar19.x2.m_i = local_d0.x2.m_i;
          QVar19.y2.m_i = local_d0.y2.m_i;
          QVar19.x1.m_i = local_d0.x1.m_i;
          QVar19.y1.m_i = local_d0.y1.m_i;
          bVar7 = this_00->pointerOutsidePressedControl;
          QVar8 = local_c0;
          if (bVar7 == (bool)bVar10) {
            this_00->pointerOutsidePressedControl = (bool)(bVar7 ^ 1);
            if (bVar7 == false) {
              this_00->pointerOutsidePressedControl = true;
              QAbstractSlider::setRepeatAction(&this->super_QAbstractSlider,SliderNoAction,500,0x32)
              ;
              QWidget::repaint((QWidget *)this,&local_c0);
              QVar19.x2.m_i = local_d0.x2.m_i;
              QVar19.y2.m_i = local_d0.y2.m_i;
              QVar19.x1.m_i = local_d0.x1.m_i;
              QVar19.y1.m_i = local_d0.y1.m_i;
              QVar8 = local_c0;
            }
            else {
              QScrollBarPrivate::activateControl(this_00,this_00->pressedControl,500);
              QVar19.x2.m_i = local_d0.x2.m_i;
              QVar19.y2.m_i = local_d0.y2.m_i;
              QVar19.x1.m_i = local_d0.x1.m_i;
              QVar19.y1.m_i = local_d0.y1.m_i;
              QVar8 = local_c0;
            }
          }
        }
        else {
          pQVar13 = QWidget::style((QWidget *)this);
          auVar20 = QEventPoint::position();
          dVar18 = (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar20._0_8_;
          dVar17 = dVar18;
          if (dVar18 <= -2147483648.0) {
            dVar17 = -2147483648.0;
          }
          local_c0.x1.m_i =
               (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
          dVar18 = (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar20._8_8_;
          dVar17 = dVar18;
          if (dVar18 <= -2147483648.0) {
            dVar17 = -2147483648.0;
          }
          local_c0.y1.m_i =
               (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                            ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
          control = (**(code **)(*(long *)pQVar13 + 0xd0))(pQVar13,2,&local_b0,&local_c0,this);
          QVar8.x2.m_i = local_c0.x2.m_i;
          QVar8.y2.m_i = local_c0.y2.m_i;
          QVar8.x1.m_i = local_c0.x1.m_i;
          QVar8.y1.m_i = local_c0.y1.m_i;
          QVar19.x2.m_i = local_d0.x2.m_i;
          QVar19.y2.m_i = local_d0.y2.m_i;
          QVar19.x1.m_i = local_d0.x1.m_i;
          QVar19.y1.m_i = local_d0.y1.m_i;
          if ((control != this_00->pressedControl) ||
             (this_00->pointerOutsidePressedControl == true)) {
            if ((control & (SC_ComboBoxEditField|SC_ComboBoxFrame)) == SC_None) goto LAB_004749f7;
            this_00->pointerOutsidePressedControl = false;
            pQVar13 = QWidget::style((QWidget *)this);
            local_c0 = (QRect)(**(code **)(*(long *)pQVar13 + 0xd8))
                                        (pQVar13,2,&local_b0,control,this);
            pQVar13 = QWidget::style((QWidget *)this);
            local_d0 = (QRect)(**(code **)(*(long *)pQVar13 + 0xd8))
                                        (pQVar13,2,&local_b0,this_00->pressedControl,this);
            QVar19 = (QRect)QRect::operator|(&local_c0,&local_d0);
            this_00->pressedControl = control;
            local_c0 = QVar19;
            QScrollBarPrivate::activateControl(this_00,control,0);
            QWidget::update((QWidget *)this,&local_c0);
            QVar19 = local_d0;
            QVar8 = local_c0;
          }
        }
      }
    }
  }
  local_d0 = QVar19;
  local_c0 = QVar8;
  QStyleOption::~QStyleOption((QStyleOption *)&local_b0);
LAB_004749d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);
    if (!d->pressedControl)
        return;

    QStyleOptionSlider opt;
    initStyleOption(&opt);
    if (!(e->buttons() & Qt::LeftButton
          ||  ((e->buttons() & Qt::MiddleButton)
               && style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition, &opt, this))))
        return;

    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        QPoint click = e->position().toPoint();
        int newPosition = d->pixelPosToRangeValue((HORIZONTAL ? click.x() : click.y()) -d->clickOffset);
        int m = style()->pixelMetric(QStyle::PM_MaximumDragDistance, &opt, this);
        if (m >= 0) {
            QRect r = rect();
            r.adjust(-m, -m, m, m);
            if (! r.contains(e->position().toPoint()))
                newPosition = d->snapBackPosition;
        }
        setSliderPosition(newPosition);
    } else if (!style()->styleHint(QStyle::SH_ScrollBar_ScrollWhenPointerLeavesControl, &opt, this)) {

        if (style()->styleHint(QStyle::SH_ScrollBar_RollBetweenButtons, &opt, this)
                && d->pressedControl & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
            QStyle::SubControl newSc = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
            if (newSc == d->pressedControl && !d->pointerOutsidePressedControl)
                return; // nothing to do
            if (newSc & (QStyle::SC_ScrollBarAddLine | QStyle::SC_ScrollBarSubLine)) {
                d->pointerOutsidePressedControl = false;
                QRect scRect = style()->subControlRect(QStyle::CC_ScrollBar, &opt, newSc, this);
                scRect |= style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
                d->pressedControl = newSc;
                d->activateControl(d->pressedControl, 0);
                update(scRect);
                return;
            }
        }

        // stop scrolling when the mouse pointer leaves a control
        // similar to push buttons
        QRect pr = style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this);
        if (pr.contains(e->position().toPoint()) == d->pointerOutsidePressedControl) {
            if ((d->pointerOutsidePressedControl = !d->pointerOutsidePressedControl)) {
                d->pointerOutsidePressedControl = true;
                setRepeatAction(SliderNoAction);
                repaint(pr);
            } else  {
                d->activateControl(d->pressedControl);
            }
        }
    }
}